

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu.h
# Opt level: O3

uint32_t basist::get_endpoint_l8(uint32_t endpoints,uint32_t endpoint_index)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  
  if (endpoint_index < 2) {
    uVar4 = endpoints >> ((endpoint_index != 0) << 4) &
            *(uint *)((long)&get_endpoint_8888(unsigned_int,unsigned_int)::s_endpoint_mask +
                     (ulong)endpoint_index * 4);
    if ((short)uVar4 < 0) {
      pbVar1 = g_pvrtc_5 + (uVar4 >> 10 & 0x1f);
      pbVar2 = g_pvrtc_5 + (uVar4 >> 5 & 0x1f);
      pbVar3 = g_pvrtc_4 + ((uVar4 & 0x1f) >> 1);
      if (endpoint_index != 0) {
        pbVar3 = g_pvrtc_5 + (uVar4 & 0x1f);
      }
      uVar4 = 0xff;
    }
    else {
      pbVar1 = g_pvrtc_4 + (uVar4 >> 8 & 0xf);
      pbVar2 = g_pvrtc_4 + (uVar4 >> 4 & 0xf);
      pbVar3 = (byte *)((long)&g_pvrtc_3 + (ulong)((uVar4 & 0xf) >> 1));
      if (endpoint_index != 0) {
        pbVar3 = g_pvrtc_4 + (uVar4 & 0xf);
      }
      uVar4 = (uint)(byte)g_pvrtc_alpha[uVar4 >> 0xc & 7];
    }
    return (uint)*pbVar3 + (uint)*pbVar1 + *pbVar2 + uVar4;
  }
  __assert_fail("v < maxv",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu.h"
                ,0xa7,"T basisu::open_range_check(T, T) [T = unsigned int]");
}

Assistant:

inline uint32_t total_bits(uint32_t v) { uint32_t l = 0; for ( ; v > 0U; ++l) v >>= 1; return l; }